

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMeshShape.cpp
# Opt level: O2

void __thiscall
btTriangleMeshShape::getAabb
          (btTriangleMeshShape *this,btTransform *trans,btVector3 *aabbMin,btVector3 *aabbMax)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar3;
  btVector3 bVar4;
  btVector3 bVar5;
  btVector3 localCenter;
  btMatrix3x3 abs_b;
  float local_d8;
  float fStack_d4;
  float local_c8;
  btVector3 local_80;
  btVector3 local_70;
  btVector3 local_60;
  btVector3 local_50;
  btVector3 local_40;
  
  bVar4 = operator-(&this->m_localAabbMax,&this->m_localAabbMin);
  fVar3 = bVar4.m_floats[2] * 0.5;
  local_70.m_floats._8_8_ = ZEXT48((uint)fVar3);
  (*(this->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  (*(this->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  (*(this->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  local_d8 = bVar4.m_floats[0];
  fStack_d4 = bVar4.m_floats[1];
  local_70.m_floats[1] = extraout_XMM0_Da_00 + fStack_d4 * 0.5;
  local_70.m_floats[0] = extraout_XMM0_Da + local_d8 * 0.5;
  local_70.m_floats[2] = extraout_XMM0_Da_01 + fVar3;
  bVar4 = operator+(&this->m_localAabbMax,&this->m_localAabbMin);
  local_80.m_floats[1] = bVar4.m_floats[1] * 0.5;
  local_80.m_floats[0] = bVar4.m_floats[0] * 0.5;
  local_80.m_floats[2] = bVar4.m_floats[2] * 0.5;
  local_80.m_floats[3] = 0.0;
  btMatrix3x3::absolute(&trans->m_basis);
  bVar4 = btTransform::operator()(trans,&local_80);
  bVar5 = btVector3::dot3(&local_70,&local_60,&local_50,&local_40);
  local_d8 = bVar4.m_floats[0];
  fStack_d4 = bVar4.m_floats[1];
  local_c8 = bVar4.m_floats[2];
  auVar1._4_4_ = fStack_d4 - bVar5.m_floats[1];
  auVar1._0_4_ = local_d8 - bVar5.m_floats[0];
  auVar1._8_4_ = local_c8 - bVar5.m_floats[2];
  auVar1._12_4_ = 0;
  *(undefined1 (*) [16])aabbMin->m_floats = auVar1;
  auVar2._4_4_ = fStack_d4 + bVar5.m_floats[1];
  auVar2._0_4_ = local_d8 + bVar5.m_floats[0];
  auVar2._8_4_ = local_c8 + bVar5.m_floats[2];
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])aabbMax->m_floats = auVar2;
  return;
}

Assistant:

void btTriangleMeshShape::getAabb(const btTransform& trans,btVector3& aabbMin,btVector3& aabbMax) const
{

	btVector3 localHalfExtents = btScalar(0.5)*(m_localAabbMax-m_localAabbMin);
	localHalfExtents += btVector3(getMargin(),getMargin(),getMargin());
	btVector3 localCenter = btScalar(0.5)*(m_localAabbMax+m_localAabbMin);
	
	btMatrix3x3 abs_b = trans.getBasis().absolute();  

	btVector3 center = trans(localCenter);

    btVector3 extent = localHalfExtents.dot3(abs_b[0], abs_b[1], abs_b[2]);
	aabbMin = center - extent;
	aabbMax = center + extent;
}